

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelLoader.cpp
# Opt level: O0

bool __thiscall
iDynTree::ModelLoader::loadReducedModelFromFullModel
          (ModelLoader *this,Model *fullModel,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *consideredJoints,
          unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>_>_>
          *removedJointPositions,string *param_5)

{
  byte bVar1;
  unordered_map *in_RCX;
  vector *in_RDX;
  Model *in_RSI;
  bool ok;
  Model _modelReduced;
  Model local_160 [280];
  Model *in_stack_ffffffffffffffb8;
  ModelLoaderPimpl *in_stack_ffffffffffffffc0;
  bool local_1;
  
  iDynTree::Model::Model(local_160);
  iDynTree::Model::getPackageDirs_abi_cxx11_();
  iDynTree::Model::setPackageDirs((vector *)local_160);
  bVar1 = iDynTree::createReducedModel(in_RSI,in_RDX,local_160,in_RCX);
  if ((bVar1 & 1) == 0) {
    local_1 = false;
  }
  else {
    std::
    unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
    ::operator->((unique_ptr<iDynTree::ModelLoader::ModelLoaderPimpl,_std::default_delete<iDynTree::ModelLoader::ModelLoaderPimpl>_>
                  *)0x18841a);
    local_1 = ModelLoaderPimpl::setModel(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  iDynTree::Model::~Model(local_160);
  return local_1;
}

Assistant:

bool ModelLoader::loadReducedModelFromFullModel(const Model& fullModel,
                                                    const std::vector< std::string >& consideredJoints,
                                                    const std::unordered_map<std::string, double>& removedJointPositions,
                                                    const std::string /*filetype*/)
    {
        Model _modelReduced;
        _modelReduced.setPackageDirs(fullModel.getPackageDirs());
        bool ok = createReducedModel(fullModel,consideredJoints,_modelReduced, removedJointPositions);

        if( !ok )
        {
            return false;
        }

        return m_pimpl->setModel(_modelReduced);
    }